

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQuant.c
# Opt level: O2

int Abc_NtkQuantify(Abc_Ntk_t *pNtk,int fUniv,int iVar,int fVerbose)

{
  Abc_Aig_t *pAVar1;
  uint __line;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  char *__assertion;
  int iVar7;
  Abc_Obj_t *pObj;
  int local_3c;
  Vec_Ptr_t *local_38;
  
  local_3c = fUniv;
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    if (iVar < pNtk->vCis->nSize) {
      pObj = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vCis,iVar);
      pVVar3 = Abc_NtkDfsReverseNodes(pNtk,&pObj,1);
      pAVar4 = Abc_AigConst1(pNtk);
      (pObj->field_6).pTemp = (void *)((ulong)pAVar4 ^ 1);
      pAVar4 = Abc_AigConst1(pNtk);
      (pObj->field_5).pData = pAVar4;
      local_38 = pVVar3;
      for (iVar7 = 0; iVar7 < local_38->nSize; iVar7 = iVar7 + 1) {
        pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(local_38,iVar7);
        if (pAVar4 != (Abc_Obj_t *)0x0) goto LAB_0025df45;
        pAVar5 = (Abc_Obj_t *)0x0;
        pObj = pAVar4;
        while (pAVar4 = pAVar5, pObj != (Abc_Obj_t *)0x0) {
          pAVar5 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
          iVar2 = Abc_NodeIsTravIdCurrent(pAVar5);
          if (iVar2 == 0) {
            (pAVar5->field_6).pCopy = pAVar5;
            (pAVar5->field_5).pData = pAVar5;
          }
          pAVar5 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]];
          iVar2 = Abc_NodeIsTravIdCurrent(pAVar5);
          pAVar6 = pObj;
          if (iVar2 == 0) {
            (pAVar5->field_6).pCopy = pAVar5;
            (pAVar5->field_5).pData = pAVar5;
          }
          pAVar1 = (Abc_Aig_t *)pNtk->pManFunc;
          pAVar5 = Abc_ObjChild0Copy(pObj);
          pAVar6 = Abc_ObjChild1Copy(pAVar6);
          pAVar6 = Abc_AigAnd(pAVar1,pAVar5,pAVar6);
          pAVar5 = pObj;
          (pObj->field_6).pCopy = pAVar6;
          pAVar1 = (Abc_Aig_t *)pNtk->pManFunc;
          pAVar6 = Abc_ObjChild0Data(pObj);
          pAVar5 = Abc_AigAnd(pAVar1,pAVar6,
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)&pAVar5->field_0x14 >> 0xb & 1) ^
                              *(ulong *)((long)pAVar5->pNtk->vObjs->pArray
                                               [(pAVar5->vFanins).pArray[1]] + 0x38)));
          (pObj->field_5).pData = pAVar5;
          pAVar5 = (Abc_Obj_t *)0x0;
          pObj = pAVar4;
          if (pAVar4 != (Abc_Obj_t *)0x0) {
LAB_0025df45:
            pAVar5 = (pAVar4->field_6).pCopy;
            pObj = pAVar4;
          }
        }
      }
      Vec_PtrFree(local_38);
      for (iVar7 = 0; iVar7 < pNtk->vCos->nSize; iVar7 = iVar7 + 1) {
        pObj = (Abc_Obj_t *)Vec_PtrEntry(pNtk->vCos,iVar7);
        iVar2 = Abc_NodeIsTravIdCurrent(pObj);
        pAVar4 = pObj;
        if (iVar2 != 0) {
          pAVar5 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
          pAVar1 = (Abc_Aig_t *)pNtk->pManFunc;
          pAVar6 = Abc_ObjChild0Copy(pObj);
          pAVar4 = Abc_ObjChild0Data(pAVar4);
          if (local_3c == 0) {
            pAVar4 = Abc_AigOr(pAVar1,pAVar6,pAVar4);
          }
          else {
            pAVar4 = Abc_AigAnd(pAVar1,pAVar6,pAVar4);
          }
          if (pAVar5 != (Abc_Obj_t *)((ulong)pAVar4 & 0xfffffffffffffffe)) {
            Abc_ObjPatchFanin(pObj,pAVar5,
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)&pObj->field_0x14 >> 10 & 1) ^ (ulong)pAVar4));
          }
        }
      }
      return 1;
    }
    __assertion = "iVar < Abc_NtkCiNum(pNtk)";
    __line = 0x59;
  }
  else {
    __assertion = "Abc_NtkIsStrash(pNtk)";
    __line = 0x58;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcQuant.c"
                ,__line,"int Abc_NtkQuantify(Abc_Ntk_t *, int, int, int)");
}

Assistant:

int Abc_NtkQuantify( Abc_Ntk_t * pNtk, int fUniv, int iVar, int fVerbose )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pObj, * pNext, * pFanin;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    assert( iVar < Abc_NtkCiNum(pNtk) );

    // collect the internal nodes
    pObj = Abc_NtkCi( pNtk, iVar );
    vNodes = Abc_NtkDfsReverseNodes( pNtk, &pObj, 1 );

    // assign the cofactors of the CI node to be constants
    pObj->pCopy = Abc_ObjNot( Abc_AigConst1(pNtk) ); 
    pObj->pData = Abc_AigConst1(pNtk); 

    // quantify the nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        for ( pNext = pObj? pObj->pCopy : pObj; pObj; pObj = pNext, pNext = pObj? pObj->pCopy : pObj )
        {
            pFanin = Abc_ObjFanin0(pObj);
            if ( !Abc_NodeIsTravIdCurrent(pFanin) )
            {
                pFanin->pCopy = pFanin;
                pFanin->pData = pFanin;
            }
            pFanin = Abc_ObjFanin1(pObj);
            if ( !Abc_NodeIsTravIdCurrent(pFanin) )
            {
                pFanin->pCopy = pFanin;
                pFanin->pData = pFanin;
            }
            pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
            pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, Abc_ObjChild0Data(pObj), Abc_ObjChild1Data(pObj) );
        }
    }
    Vec_PtrFree( vNodes );

    // update the affected COs
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        if ( !Abc_NodeIsTravIdCurrent(pObj) )
            continue;
        pFanin = Abc_ObjFanin0(pObj);
        // get the result of quantification
        if ( fUniv )
            pNext = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild0Data(pObj) );
        else
            pNext = Abc_AigOr( (Abc_Aig_t *)pNtk->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild0Data(pObj) );
        pNext = Abc_ObjNotCond( pNext, Abc_ObjFaninC0(pObj) );
        if ( Abc_ObjRegular(pNext) == pFanin )
            continue;
        // update the fanins of the CO
        Abc_ObjPatchFanin( pObj, pFanin, pNext );
//        if ( Abc_ObjFanoutNum(pFanin) == 0 )
//            Abc_AigDeleteNode( pNtk->pManFunc, pFanin );
    }

    // make sure the node has no fanouts
//    pObj = Abc_NtkCi( pNtk, iVar );
//    assert( Abc_ObjFanoutNum(pObj) == 0 );
    return 1;
}